

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O0

const_iterator __thiscall
burst::k_ary_search_set<int,_std::less<void>_>::find_impl
          (k_ary_search_set<int,_std::less<void>_> *this,value_type_conflict2 *value)

{
  size_t arity;
  bool bVar1;
  int *piVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  const_iterator cVar3;
  long *plVar4;
  reference __u;
  size_t child_number;
  difference_type local_50;
  long local_48;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  const_iterator node_end;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  const_iterator node_begin;
  size_t node_index;
  value_type_conflict2 *value_local;
  k_ary_search_set<int,_std::less<void>_> *this_local;
  const_iterator search_result;
  
  node_begin._M_current = (int *)0x0;
  do {
    cVar3._M_current = node_begin._M_current;
    piVar2 = (int *)std::vector<int,_std::allocator<int>_>::size(&this->m_values);
    if (piVar2 <= cVar3._M_current) {
      cVar3 = end(this);
      return (const_iterator)cVar3._M_current;
    }
    node_end = begin(this);
    __first = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator+(&node_end,node_begin._M_current);
    local_48 = this->m_arity - 1;
    local_30 = __first;
    cVar3 = end(this);
    local_50 = std::
               distance<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                         (__first,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                   )cVar3._M_current);
    plVar4 = std::min<long>(&local_48,&local_50);
    local_40 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&local_30,*plVar4);
    this_local = (k_ary_search_set<int,_std::less<void>_> *)
                 std::
                 lower_bound<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int,std::less<void>>
                           (local_30._M_current,local_40._M_current,value);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &this_local,&local_40);
    if (bVar1) {
      __u = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
            operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                      &this_local);
      bVar1 = (((std::forward<int_const&>)({parm#1}))<((std::forward<int_const&>)({parm#2})))std::
              less<void>::operator()(&this->field_0x20,value,__u);
      if (!bVar1) {
        return (const_iterator)(int *)this_local;
      }
    }
    cVar3._M_current = node_begin._M_current;
    arity = this->m_arity;
    child_number = std::
                   distance<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                             (local_30,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                        )this_local);
    node_begin._M_current = (int *)perfect_tree_child_index(arity,cVar3._M_current,child_number);
  } while( true );
}

Assistant:

const_iterator find_impl (const value_type & value) const
        {
            std::size_t node_index = 0;

            while (node_index < m_values.size())
            {
                const_iterator node_begin = begin() + static_cast<difference_type>(node_index);
                const_iterator node_end =
                    node_begin +
                    std::min
                    (
                        static_cast<difference_type>(m_arity - 1),
                        std::distance(node_begin, end())
                    );

                const_iterator search_result =
                    std::lower_bound(node_begin, node_end, value, m_compare);
                if (search_result != node_end && not m_compare(value, *search_result))
                {
                    return search_result;
                }
                else
                {
                    node_index = perfect_tree_child_index
                    (
                        m_arity,
                        node_index,
                        static_cast<std::size_t>(std::distance(node_begin, search_result))
                    );
                }
            }

            return end();
        }